

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O1

bool __thiscall DBSCAN::Fit(DBSCAN *this)

{
  pointer pEVar1;
  long *plVar2;
  int clusterId;
  long lVar3;
  ulong uVar4;
  
  if (this->emb_num == 0) {
    clusterId = 0;
  }
  else {
    clusterId = 0;
    lVar3 = 0x809;
    uVar4 = 0;
    do {
      pEVar1 = (this->embs).super__Vector_base<Embedding,_std::allocator<Embedding>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((*(char *)((long)pEVar1->emb + lVar3 + -4) == '\0') &&
         (*(char *)((long)pEVar1->emb + lVar3 + 0xfffffffffffffffbU) == '\x01')) {
        *(int *)((long)pEVar1->emb + lVar3 + 0xfffffffffffffff7U) = clusterId;
        *(undefined1 *)((long)pEVar1->emb + lVar3 + -4) = 1;
        KeyEmbCluster(this,(uint)uVar4,clusterId);
        clusterId = clusterId + 1;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x828;
    } while (uVar4 < this->emb_num);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cluster ID",10);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,clusterId);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return true;
}

Assistant:

bool DBSCAN::Fit()
{
    int clusterId=0;                        //聚类id计数，初始化为0
    for(unsigned long i=0; i<this->emb_num;i++)            //对每一个数据点执行
    {
        Embedding& emb = this->embs[i];                    //取到第i个数据点对象
        if(!emb.IsVisited() && emb.IsKey())            //若对象没被访问过，并且是核心对象执行
        {
            emb.SetClusterID(clusterId);                //设置该对象所属簇ID为clusterId
            emb.SetVisited(true);                    //设置该对象已被访问过
            this->KeyEmbCluster(i, clusterId);            //对该对象领域内点进行聚类
            clusterId++;                            //clusterId自增1
        }
        //cout << "孤立点\T" << i << endl;
    }

    std::cout <<"cluster ID" <<clusterId<<std::endl;        //算法完成后，输出聚类个数
    return true;    //返回
}